

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O1

int __thiscall crnlib::rg_etc1::etc1_optimizer::init(etc1_optimizer *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint *puVar5;
  uint i_2;
  long lVar6;
  uint uVar7;
  uint uVar8;
  results *in_RDX;
  long lVar9;
  uint i_1;
  long lVar10;
  uint i_3;
  uint32 (*pIndices0) [8];
  float fVar11;
  vec3F avg_color;
  vec3F fc;
  undefined8 local_40;
  float local_38;
  float local_34 [3];
  
  this->m_pParams = (params *)ctx;
  this->m_pResult = in_RDX;
  uVar4 = ((byte)ctx[0x18] ^ 1) << 4 | 0xf;
  this->m_limit = uVar4;
  local_40 = 0;
  local_38 = 0.0;
  lVar6 = *(long *)(ctx + 0x10);
  lVar9 = 0;
  do {
    bVar1 = *(byte *)(lVar6 + lVar9 * 4);
    bVar2 = *(byte *)(lVar6 + 1 + lVar9 * 4);
    bVar3 = *(byte *)(lVar6 + 2 + lVar9 * 4);
    local_34[0] = (float)bVar1;
    local_34[1] = (float)bVar2;
    local_34[2] = (float)bVar3;
    lVar10 = 0;
    do {
      *(float *)((long)&local_40 + lVar10 * 4) =
           local_34[lVar10] + *(float *)((long)&local_40 + lVar10 * 4);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    this->m_luma[lVar9] = (ushort)bVar2 + (ushort)bVar1 + (ushort)bVar3;
    this->m_sorted_luma[0][lVar9] = (uint32)lVar9;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  lVar6 = 0;
  do {
    *(float *)((long)&local_40 + lVar6 * 4) = *(float *)((long)&local_40 + lVar6 * 4) * 0.125;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  *(undefined8 *)(this->m_avg_color).m_s = local_40;
  fVar11 = (float)uVar4;
  uVar7 = (uint)(long)(((this->m_avg_color).m_s[0] * fVar11) / 255.0 + 0.5);
  uVar8 = uVar4;
  if ((int)uVar7 < (int)uVar4) {
    uVar8 = uVar7;
  }
  if ((int)uVar7 < 0) {
    uVar8 = 0;
  }
  (this->m_avg_color).m_s[2] = local_38;
  this->m_br = uVar8;
  uVar7 = (uint)(long)(((this->m_avg_color).m_s[1] * fVar11) / 255.0 + 0.5);
  uVar8 = uVar4;
  if ((int)uVar7 < (int)uVar4) {
    uVar8 = uVar7;
  }
  if ((int)uVar7 < 0) {
    uVar8 = 0;
  }
  this->m_bg = uVar8;
  uVar8 = (uint)(long)((fVar11 * (this->m_avg_color).m_s[2]) / 255.0 + 0.5);
  if ((int)uVar8 < (int)uVar4) {
    uVar4 = uVar8;
  }
  if ((int)uVar8 < 0) {
    uVar4 = 0;
  }
  this->m_bb = uVar4;
  if (*(int *)ctx < 2) {
    pIndices0 = this->m_sorted_luma;
    lVar6 = 0;
    puVar5 = indirect_radix_sort<unsigned_int,unsigned_short>
                       (8,*pIndices0,this->m_sorted_luma[1],this->m_luma,0,2,false);
    this->m_pSorted_luma_indices = puVar5;
    if ((uint32 (*) [8])puVar5 == pIndices0) {
      pIndices0 = this->m_sorted_luma + 1;
    }
    this->m_pSorted_luma = *pIndices0;
    do {
      (*pIndices0)[lVar6] = (uint)this->m_luma[puVar5[lVar6]];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
  }
  (this->m_best_solution).m_coords.m_color4 = false;
  (this->m_best_solution).m_coords.m_unscaled_color =
       (anon_union_4_3_dd316fa8_for_color_quad_u8_0)0x0;
  (this->m_best_solution).m_coords.m_inten_table = 0;
  (this->m_best_solution).m_valid = false;
  (this->m_best_solution).m_error = 0xffffffffffffffff;
  return 0;
}

Assistant:

void etc1_optimizer::init(const params& p, results& r)
        {
            // This version is hardcoded for 8 pixel subblocks.
            RG_ETC1_ASSERT(p.m_num_src_pixels == 8);

            m_pParams = &p;
            m_pResult = &r;

            const uint n = 8;

            m_limit = m_pParams->m_use_color4 ? 15 : 31;

            vec3F avg_color(0.0f);

            for (uint i = 0; i < n; i++)
            {
                const color_quad_u8& c = m_pParams->m_pSrc_pixels[i];
                const vec3F fc(c.r, c.g, c.b);

                avg_color += fc;

                m_luma[i] = static_cast<uint16>(c.r + c.g + c.b);
                m_sorted_luma[0][i] = i;
            }
            avg_color *= (1.0f / static_cast<float>(n));
            m_avg_color = avg_color;

            m_br = rg_etc1::clamp<int>(static_cast<uint>(m_avg_color[0] * m_limit / 255.0f + .5f), 0, m_limit);
            m_bg = rg_etc1::clamp<int>(static_cast<uint>(m_avg_color[1] * m_limit / 255.0f + .5f), 0, m_limit);
            m_bb = rg_etc1::clamp<int>(static_cast<uint>(m_avg_color[2] * m_limit / 255.0f + .5f), 0, m_limit);

            if (m_pParams->m_quality <= cMediumQuality)
            {
                m_pSorted_luma_indices = indirect_radix_sort(n, m_sorted_luma[0], m_sorted_luma[1], m_luma, 0, sizeof(m_luma[0]), false);
                m_pSorted_luma = m_sorted_luma[0];
                if (m_pSorted_luma_indices == m_sorted_luma[0])
                {
                    m_pSorted_luma = m_sorted_luma[1];
                }

                for (uint i = 0; i < n; i++)
                {
                    m_pSorted_luma[i] = m_luma[m_pSorted_luma_indices[i]];
                }
            }

            m_best_solution.m_coords.clear();
            m_best_solution.m_valid = false;
            m_best_solution.m_error = cUINT64_MAX;
        }